

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::~IfcOccupant(IfcOccupant *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcActor).super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcActor).super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18)) =
       vtt[0x19];
  *(void **)&(this->super_IfcActor).super_IfcObject.field_0x88 = vtt[0x1a];
  (this->super_IfcActor).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcActor).super_IfcObject.field_0xd0 = vtt[0x1c];
  *(void **)&(this->super_IfcActor).field_0xf0 = vtt[0x1d];
  std::__cxx11::string::~string((string *)&(this->super_IfcActor).field_0x100);
  IfcActor::~IfcActor(&this->super_IfcActor,vtt + 1);
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}